

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateAutoRefFunctionSet(ExpressionContext *ctx,SynBase *source,ExprBase *value,InplaceStr name)

{
  FunctionData *pFVar1;
  TypeBase *pTVar2;
  long lVar3;
  TypeFunction *pTVar4;
  uint uVar5;
  int iVar6;
  FunctionData **ppFVar7;
  undefined4 extraout_var;
  TypeFunctionSet *pTVar9;
  ExprBase *pEVar10;
  IntrusiveList<FunctionHandle> *pIVar11;
  uint i;
  uint index;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<FunctionHandle> functions;
  TypeFunction *local_d0;
  SmallArray<TypeBase_*,_16U> types;
  FunctionHandle *pFVar8;
  undefined4 extraout_var_00;
  
  types.allocator = ctx->allocator;
  types.data = types.little;
  types.count = 0;
  types.max = 0x10;
  functions.head = (FunctionHandle *)0x0;
  functions.tail = (FunctionHandle *)0x0;
  index = 0;
  do {
    if ((ctx->functions).count <= index) {
      if (functions.head == (FunctionHandle *)0x0) {
        if ((TypeStruct *)value->type == ctx->typeAutoRef) {
          anon_unknown.dwarf_94284::Stop
                    (ctx,source,"ERROR: function \'%.*s\' is undefined in any of existing classes",
                     (ulong)(uint)((int)name.end - (int)name.begin),name.begin);
        }
        pEVar10 = (ExprBase *)0x0;
      }
      else {
        setTypes.count = types.count;
        setTypes.data = types.data;
        setTypes._12_4_ = 0;
        pTVar9 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar10 = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
        pEVar10->typeID = 0x27;
        pEVar10->source = source;
        pEVar10->type = &pTVar9->super_TypeBase;
        pEVar10->next = (ExprBase *)0x0;
        pEVar10->listed = false;
        pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223e80;
        pEVar10[1]._vptr_ExprBase = (_func_int **)functions.head;
        *(FunctionHandle **)&pEVar10[1].typeID = functions.tail;
        pEVar10[1].source = (SynBase *)value;
      }
      SmallArray<TypeBase_*,_16U>::~SmallArray(&types);
      return pEVar10;
    }
    ppFVar7 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,index);
    pFVar1 = *ppFVar7;
    pTVar2 = pFVar1->scope->ownerType;
    if (pTVar2 != (TypeBase *)0x0) {
      uVar5 = NULLC::StringHashContinue(pTVar2->nameHash,"::");
      uVar5 = NULLC::StringHashContinue(uVar5,name.begin,name.end);
      if (((pFVar1->nameHash == uVar5) && ((pFVar1->generics).head == (MatchData *)0x0)) &&
         ((pTVar2 = pFVar1->scope->ownerType, pTVar2->isGeneric != true ||
          ((pTVar2->typeID != 0x16 ||
           (lVar3._0_4_ = pTVar2[2].typeID, lVar3._4_4_ = pTVar2[2].nameHash, lVar3 != 0)))))) {
        pTVar4 = pFVar1->type;
        if ((pTVar4->super_TypeBase).isGeneric == false) {
          pIVar11 = &functions;
          do {
            pFVar8 = pIVar11->head;
            if (pFVar8 == (FunctionHandle *)0x0) goto LAB_001538c0;
            pIVar11 = (IntrusiveList<FunctionHandle> *)&pFVar8->next;
          } while (pFVar8->function->type != pTVar4);
        }
        else {
LAB_001538c0:
          local_d0 = pTVar4;
          SmallArray<TypeBase_*,_16U>::push_back(&types,(TypeBase **)&local_d0);
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pFVar8 = (FunctionHandle *)CONCAT44(extraout_var,iVar6);
          pFVar8->function = pFVar1;
          pFVar8->next = (FunctionHandle *)0x0;
          pFVar8->listed = false;
          IntrusiveList<FunctionHandle>::push_back(&functions,pFVar8);
        }
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

ExprBase* CreateAutoRefFunctionSet(ExpressionContext &ctx, SynBase *source, ExprBase *value, InplaceStr name)
{
	SmallArray<TypeBase*, 16> types(ctx.allocator);
	IntrusiveList<FunctionHandle> functions;

	// Find all member functions with the specified name
	for(unsigned i = 0; i < ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.functions[i];

		TypeBase *parentType = function->scope->ownerType;

		if(!parentType)
			continue;

		unsigned hash = NULLC::StringHashContinue(parentType->nameHash, "::");

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(function->nameHash != hash)
			continue;

		// Can't specify generic function arguments for call through 'auto ref'
		if(!function->generics.empty())
			continue;

		// Ignore generic types if they don't have a single instance
		if(function->scope->ownerType->isGeneric)
		{
			if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(function->scope->ownerType))
			{
				if(proto->instances.empty())
					continue;
			}
		}

		FunctionHandle *prev = NULL;

		// Pointer to generic types don't stricly match because they might be resolved to different types
		if (!function->type->isGeneric)
		{
			for(FunctionHandle *curr = functions.head; curr; curr = curr->next)
			{
				if(curr->function->type == function->type)
				{
					prev = curr;
					break;
				}
			}
		}

		if(prev)
			continue;

		types.push_back(function->type);
		functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function));
	}

	if(functions.empty())
	{
		if(value->type != ctx.typeAutoRef)
			return NULL;

		Stop(ctx, source, "ERROR: function '%.*s' is undefined in any of existing classes", FMT_ISTR(name));
	}

	TypeFunctionSet *type = ctx.GetFunctionSetType(types);

	return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, value);
}